

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,uint64 param_1,void *pData_ptr)

{
  uint uVar1;
  vq_node *pvVar2;
  uint64 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  uint end_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_5c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_58;
  value_type local_30;
  
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = *(uint *)((long)pData_ptr + 4);
  uVar10 = *pData_ptr;
  pvVar2 = (this->m_nodes).m_p;
  if (local_5c != uVar10) {
    lVar11 = 0;
    do {
      pvVar2[local_5c].m_centroid.m_s[lVar11] = pvVar2[uVar10].m_centroid.m_s[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
  }
  *(undefined4 *)((long)&pvVar2[local_5c].m_codebook_index + 3) =
       *(undefined4 *)((long)&pvVar2[uVar10].m_codebook_index + 3);
  uVar3 = pvVar2[uVar10].m_total_weight;
  fVar7 = pvVar2[uVar10].m_variance;
  uVar8 = pvVar2[uVar10].m_begin;
  iVar4 = pvVar2[uVar10].m_left;
  iVar5 = pvVar2[uVar10].m_right;
  iVar6 = pvVar2[uVar10].m_codebook_index;
  pvVar2[local_5c].m_end = pvVar2[uVar10].m_end;
  pvVar2[local_5c].m_left = iVar4;
  pvVar2[local_5c].m_right = iVar5;
  pvVar2[local_5c].m_codebook_index = iVar6;
  pvVar2[local_5c].m_total_weight = uVar3;
  pvVar2[local_5c].m_variance = fVar7;
  pvVar2[local_5c].m_begin = uVar8;
  local_30.m_variance = (this->m_nodes).m_p[local_5c].m_variance;
  local_30.m_index = local_5c;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_58,&local_30);
  local_5c = local_5c + 1;
  if (1 < *(uint *)((long)pData_ptr + 8)) {
    uVar10 = 1;
    do {
      bVar9 = split_node(this,&local_58,&local_5c,(task_pool *)0x0);
      if (!bVar9) break;
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)((long)pData_ptr + 8));
  }
  uVar10 = *pData_ptr;
  uVar1 = *(uint *)((long)pData_ptr + 4);
  pvVar2 = (this->m_nodes).m_p;
  if (uVar10 != uVar1) {
    lVar11 = 0;
    do {
      pvVar2[uVar10].m_centroid.m_s[lVar11] = pvVar2[uVar1].m_centroid.m_s[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 == 1);
  }
  *(undefined4 *)((long)&pvVar2[uVar10].m_codebook_index + 3) =
       *(undefined4 *)((long)&pvVar2[uVar1].m_codebook_index + 3);
  uVar3 = pvVar2[uVar1].m_total_weight;
  fVar7 = pvVar2[uVar1].m_variance;
  uVar8 = pvVar2[uVar1].m_begin;
  iVar4 = pvVar2[uVar1].m_left;
  iVar5 = pvVar2[uVar1].m_right;
  iVar6 = pvVar2[uVar1].m_codebook_index;
  pvVar2[uVar10].m_end = pvVar2[uVar1].m_end;
  pvVar2[uVar10].m_left = iVar4;
  pvVar2[uVar10].m_right = iVar5;
  pvVar2[uVar10].m_codebook_index = iVar6;
  pvVar2[uVar10].m_total_weight = uVar3;
  pvVar2[uVar10].m_variance = fVar7;
  pvVar2[uVar10].m_begin = uVar8;
  (this->m_nodes).m_p[*pData_ptr].m_alternative = true;
  if (local_58.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void split_alternative_node_task(uint64, void* pData_ptr)
        {
            split_alternative_node_task_params* pParams = (split_alternative_node_task_params*)pData_ptr;
            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = pParams->alternative_node, end_node = begin_node, splits = 0;

            m_nodes[end_node] = m_nodes[pParams->main_node];
            node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
            end_node++;
            splits++;

            while (splits < pParams->max_splits && split_node(node_queue, end_node))
            {
                splits++;
            }

            m_nodes[pParams->main_node] = m_nodes[pParams->alternative_node];
            m_nodes[pParams->main_node].m_alternative = true;
        }